

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20M303DLHC.cpp
# Opt level: O0

bool __thiscall RTIMUGD20M303DLHC::setGyroCTRL5(RTIMUGD20M303DLHC *this)

{
  bool bVar1;
  uchar ctrl5;
  RTIMUGD20M303DLHC *this_local;
  
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_gyroSlaveAddr
                             ,'$','\x10',"Failed to set L3GD20 CTRL5");
  return bVar1;
}

Assistant:

bool RTIMUGD20M303DLHC::setGyroCTRL5()
{
    unsigned char ctrl5;

    //  Turn on hpf

    ctrl5 = 0x10;

#ifdef GD20M303DLHC_CACHE_MODE
    //  turn on fifo

    ctrl5 |= 0x40;
#endif

    return m_settings->HALWrite(m_gyroSlaveAddr,  L3GD20_CTRL5, ctrl5, "Failed to set L3GD20 CTRL5");
}